

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

ostream * __thiscall smf::Options::print(Options *this,ostream *out)

{
  pointer ppOVar1;
  ostream *poVar2;
  Option_register **item;
  pointer ppOVar3;
  
  ppOVar1 = (this->m_optionRegister).
            super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppOVar3 = (this->m_optionRegister).
                 super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppOVar3 != ppOVar1;
      ppOVar3 = ppOVar3 + 1) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,((*ppOVar3)->m_definition)._M_dataplus._M_p,
                        ((*ppOVar3)->m_definition)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,((*ppOVar3)->m_description)._M_dataplus._M_p,
                        ((*ppOVar3)->m_description)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return out;
}

Assistant:

std::ostream& Options::print(std::ostream& out) {
	for (auto &item : m_optionRegister) {
		out << item->getDefinition() << "\t"
			  << item->getDescription() << std::endl;
	}
	return out;
}